

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# board.cc
# Opt level: O3

bool __thiscall board::Board::sqAttacked(Board *this,int square,int side)

{
  uint uVar1;
  bool bVar2;
  ulong uVar3;
  int *piVar4;
  ulong uVar5;
  int i;
  long lVar6;
  
  if (side == 0) {
    if ((this->board[(long)square + -0xb] == 1) || (this->board[(long)square + -9] == 1)) {
      return true;
    }
  }
  else if (side == 1) {
    if (this->board[(long)square + 0xb] == 7) {
      return true;
    }
    bVar2 = true;
    if (this->board[(long)square + 9] == 7) {
      return true;
    }
    goto LAB_0012e03e;
  }
  bVar2 = false;
LAB_0012e03e:
  lVar6 = 0;
  do {
    if (this->board[(long)MOVE_DIR[2][lVar6] + (long)square] == 2 && side == 0) {
      return true;
    }
    if ((bool)(this->board[(long)MOVE_DIR[2][lVar6] + (long)square] == 8 & bVar2)) {
      return true;
    }
    lVar6 = lVar6 + 1;
  } while (lVar6 != 8);
  lVar6 = 0;
  do {
    for (piVar4 = this->board + (MOVE_DIR[4][lVar6] + square); uVar1 = *piVar4, uVar1 == 0;
        piVar4 = piVar4 + MOVE_DIR[4][lVar6]) {
    }
    if (uVar1 != 99) {
      if ((uVar1 & 0xfffffffe) == 4 && side == 0) {
        return true;
      }
      if ((bool)((uVar1 & 0xfffffffe) == 10 & bVar2)) {
        return true;
      }
    }
    lVar6 = lVar6 + 1;
  } while (lVar6 != 4);
  lVar6 = 0;
  do {
    for (piVar4 = this->board + (MOVE_DIR[3][lVar6] + square); uVar1 = *piVar4, uVar1 == 0;
        piVar4 = piVar4 + MOVE_DIR[3][lVar6]) {
    }
    if (uVar1 != 99) {
      if (side == 0) {
        if (uVar1 == 3) {
          return true;
        }
        if (uVar1 == 5) {
          return true;
        }
      }
      if ((bVar2) && ((uVar1 | 2) == 0xb)) {
        return true;
      }
    }
    lVar6 = lVar6 + 1;
    if (lVar6 == 4) {
      uVar3 = 0;
      while( true ) {
        uVar5 = uVar3;
        if (this->board[(long)MOVE_DIR[6][uVar5] + (long)square] == 6 && side == 0) {
          return true;
        }
        if ((bool)(this->board[(long)MOVE_DIR[6][uVar5] + (long)square] == 0xc & bVar2)) break;
        uVar3 = uVar5 + 1;
        if (uVar5 + 1 == 8) {
          return uVar5 < 7;
        }
      }
      return true;
    }
  } while( true );
}

Assistant:

bool board::Board::sqAttacked(const int square, const int side) const
{
    int targetSquare;
    int piece;
    if (side == WHITE && (board[square - 11] == WP || board[square - 9] == WP)) {
        return true;
    }
    if (side == BLACK && (board[square + 11] == BP || board[square + 9] == BP)) {
        return true;
    }
    for (int i = 0; i < 8; i++) {
        piece = board[square + MOVE_DIR[WN][i]];
        if (side == WHITE && piece == WN) {
            return true;
        }
        if (side == BLACK && piece == BN) {
            return true;
        }
    }
    for (int i = 0; i < 4; i++) {
        targetSquare = square + MOVE_DIR[WR][i];
        piece = board[targetSquare];
        while (piece != NO_SQ) {
            if (piece != EMPTY) {
                if (side == WHITE && (board[targetSquare] == WR || board[targetSquare] == WQ)) {
                    return true;
                }
                if (side == BLACK && (board[targetSquare] == BR || board[targetSquare] == BQ)) {
                    return true;
                }
                break;
            }
            targetSquare += MOVE_DIR[WR][i];
            piece = board[targetSquare];
        }
    }
    for (int i = 0; i < 4; i++) {
        targetSquare = square + MOVE_DIR[WB][i];
        piece = board[targetSquare];
        while (piece != NO_SQ) {
            if (piece != EMPTY) {
                if (side == WHITE && (board[targetSquare] == WB || board[targetSquare] == WQ)) {
                    return true;
                }
                if (side == BLACK && (board[targetSquare] == BB || board[targetSquare] == BQ)) {
                    return true;
                }
                break;
            }
            targetSquare += MOVE_DIR[WB][i];
            piece = board[targetSquare];
        }
    }
    for (int i = 0; i < 8; i++) {
        piece = board[square + MOVE_DIR[WK][i]];
        if ((side == WHITE && piece == WK) || (side == BLACK && piece == BK)) {
            return true;
        }
    }
    return false;
}